

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  size_t n;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = 0;
  uVar3 = 0;
  while( true ) {
    n = in->size_;
    if ((in->size_ == sVar2) || (bVar1 = in->data_[sVar2], n = sVar2, (byte)(bVar1 - 0x3a) < 0xf6))
    {
      *val = uVar3;
      Slice::remove_prefix(in,n);
      return n != 0;
    }
    if ((0x1999999999999999 < uVar3) || (uVar3 == 0x1999999999999999 && 0x35 < bVar1)) break;
    uVar3 = (ulong)(bVar1 & 0xf) + uVar3 * 10;
    sVar2 = sVar2 + 1;
  }
  return false;
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}